

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_arg.cxx
# Opt level: O0

int Fl::arg(int argc,char **argv,int *i)

{
  char *pcVar1;
  int iVar2;
  undefined1 local_44 [4];
  undefined1 local_40 [4];
  uint gh;
  uint gw;
  int gy;
  int gx;
  int flags;
  char *v;
  char *s;
  int *i_local;
  char **argv_local;
  int argc_local;
  
  arg_called = '\x01';
  pcVar1 = argv[*i];
  if (pcVar1 == (char *)0x0) {
    *i = *i + 1;
    argv_local._4_4_ = 1;
  }
  else if (((*pcVar1 == '-') && (pcVar1[1] != '-')) && (pcVar1[1] != '\0')) {
    v = pcVar1 + 1;
    s = (char *)i;
    i_local = (int *)argv;
    argv_local._0_4_ = argc;
    iVar2 = fl_match(v,"iconic",1);
    if (iVar2 == 0) {
      iVar2 = fl_match(v,"kbd",1);
      if (iVar2 == 0) {
        iVar2 = fl_match(v,"nokbd",3);
        if (iVar2 == 0) {
          iVar2 = fl_match(v,"dnd",2);
          if (iVar2 == 0) {
            iVar2 = fl_match(v,"nodnd",3);
            if (iVar2 == 0) {
              iVar2 = fl_match(v,"tooltips",2);
              if (iVar2 == 0) {
                iVar2 = fl_match(v,"notooltips",3);
                if (iVar2 == 0) {
                  _gx = *(char **)(i_local + (long)(*(int *)s + 1) * 2);
                  if ((*(int *)s < (int)argv_local + -1) && (_gx != (char *)0x0)) {
                    iVar2 = fl_match(v,"geometry",1);
                    if (iVar2 == 0) {
                      iVar2 = fl_match(v,"display",2);
                      if (iVar2 == 0) {
                        iVar2 = fl_match(v,"title",2);
                        if (iVar2 == 0) {
                          iVar2 = fl_match(v,"name",2);
                          if (iVar2 == 0) {
                            iVar2 = fl_match(v,"bg2",3);
                            if ((iVar2 == 0) && (iVar2 = fl_match(v,"background2",0xb), iVar2 == 0))
                            {
                              iVar2 = fl_match(v,"bg",2);
                              if ((iVar2 == 0) && (iVar2 = fl_match(v,"background",10), iVar2 == 0))
                              {
                                iVar2 = fl_match(v,"fg",2);
                                if ((iVar2 == 0) &&
                                   (iVar2 = fl_match(v,"foreground",10), iVar2 == 0)) {
                                  iVar2 = fl_match(v,"scheme",1);
                                  if (iVar2 == 0) {
                                    return 0;
                                  }
                                  scheme(_gx);
                                }
                                else {
                                  fl_fg = _gx;
                                }
                              }
                              else {
                                fl_bg = _gx;
                              }
                            }
                            else {
                              fl_bg2 = _gx;
                            }
                          }
                          else {
                            ::name = _gx;
                          }
                        }
                        else {
                          ::title = _gx;
                        }
                      }
                      else {
                        display(_gx);
                      }
                    }
                    else {
                      iVar2 = XParseGeometry(_gx,&gw,&gh,local_40,local_44);
                      if (iVar2 == 0) {
                        return 0;
                      }
                      geometry = _gx;
                    }
                    *(int *)s = *(int *)s + 2;
                    argv_local._4_4_ = 2;
                  }
                  else {
                    argv_local._4_4_ = 0;
                  }
                }
                else {
                  Fl_Tooltip::disable();
                  *(int *)s = *(int *)s + 1;
                  argv_local._4_4_ = 1;
                }
              }
              else {
                Fl_Tooltip::enable(1);
                *(int *)s = *(int *)s + 1;
                argv_local._4_4_ = 1;
              }
            }
            else {
              dnd_text_ops(0);
              *(int *)s = *(int *)s + 1;
              argv_local._4_4_ = 1;
            }
          }
          else {
            dnd_text_ops(1);
            *(int *)s = *(int *)s + 1;
            argv_local._4_4_ = 1;
          }
        }
        else {
          visible_focus(0);
          *(int *)s = *(int *)s + 1;
          argv_local._4_4_ = 1;
        }
      }
      else {
        visible_focus(1);
        *(int *)s = *(int *)s + 1;
        argv_local._4_4_ = 1;
      }
    }
    else {
      fl_show_iconic = '\x01';
      *(int *)s = *(int *)s + 1;
      argv_local._4_4_ = 1;
    }
  }
  else {
    return_i = '\x01';
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int Fl::arg(int argc, char **argv, int &i) {
  arg_called = 1;
  const char *s = argv[i];

  if (!s) {i++; return 1;}	// something removed by calling program?

  // a word that does not start with '-', or a word after a '--', or
  // the word '-' by itself all start the "non-switch arguments" to
  // a program.  Return 0 to indicate that we don't understand the
  // word, but set a flag (return_i) so that args() will return at
  // that point:
  if (s[0] != '-' || s[1] == '-' || !s[1]) {return_i = 1; return 0;}
  s++; // point after the dash

  if (fl_match(s, "iconic")) {
    fl_show_iconic = 1;
    i++;
    return 1;
  } else if (fl_match(s, "kbd")) {
    Fl::visible_focus(1);
    i++;
    return 1;
  } else if (fl_match(s, "nokbd", 3)) {
    Fl::visible_focus(0);
    i++;
    return 1;
  } else if (fl_match(s, "dnd", 2)) {
    Fl::dnd_text_ops(1);
    i++;
    return 1;
  } else if (fl_match(s, "nodnd", 3)) {
    Fl::dnd_text_ops(0);
    i++;
    return 1;
  } else if (fl_match(s, "tooltips", 2)) {
    Fl_Tooltip::enable();
    i++;
    return 1;
  } else if (fl_match(s, "notooltips", 3)) {
    Fl_Tooltip::disable();
    i++;
    return 1;
  }
#ifdef __APPLE__
  // The Finder application in MacOS X passes the "-psn_N_NNNNN" option
  // to all apps...
  else if (strcmp(s, "NSDocumentRevisionsDebugMode") == 0) {
    i++;
    if (argv[i]) i++;
    return 1;
  } else if (strncmp(s, "psn_", 4) == 0) {
    i++;
    return 1;
  }
#endif // __APPLE__

  const char *v = argv[i+1];
  if (i >= argc-1 || !v)
    return 0;	// all the rest need an argument, so if missing it is an error

  if (fl_match(s, "geometry")) {

    int flags, gx, gy; unsigned int gw, gh;
    flags = XParseGeometry(v, &gx, &gy, &gw, &gh);
    if (!flags) return 0;
    geometry = v;

#if !defined(WIN32) && !defined(__APPLE__)
  } else if (fl_match(s, "display", 2)) {
    Fl::display(v);
#endif

  } else if (fl_match(s, "title", 2)) {
    title = v;

  } else if (fl_match(s, "name", 2)) {
    name = v;

  } else if (fl_match(s, "bg2", 3) || fl_match(s, "background2", 11)) {
    fl_bg2 = v;

  } else if (fl_match(s, "bg", 2) || fl_match(s, "background", 10)) {
    fl_bg = v;

  } else if (fl_match(s, "fg", 2) || fl_match(s, "foreground", 10)) {
    fl_fg = v;

  } else if (fl_match(s, "scheme", 1)) {
    Fl::scheme(v);

  } else return 0; // unrecognized

  i += 2;
  return 2;
}